

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O3

void __thiscall
MeCab::FreeList<mecab_dictionary_info_t>::~FreeList(FreeList<mecab_dictionary_info_t> *this)

{
  ~FreeList(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }